

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

string * flatbuffers::ConCatPathFileName
                   (string *__return_storage_ptr__,string *path,string *filename)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  char *pcVar4;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  sVar2 = __return_storage_ptr__->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = pcVar3[sVar2 - 1];
    if (cVar1 != '/') {
      if (cVar1 == '\\') {
        pcVar3[sVar2 - 1] = '/';
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
  if ((*pcVar4 == '.') && (pcVar4[1] == '/')) {
    std::__cxx11::string::erase((ulong)__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConCatPathFileName(const std::string &path,
                               const std::string &filename) {
  std::string filepath = path;
  if (filepath.length()) {
    char &filepath_last_character = filepath.back();
    if (filepath_last_character == kPathSeparatorWindows) {
      filepath_last_character = kPathSeparator;
    } else if (filepath_last_character != kPathSeparator) {
      filepath += kPathSeparator;
    }
  }
  filepath += filename;
  // Ignore './' at the start of filepath.
  if (filepath[0] == '.' && filepath[1] == kPathSeparator) {
    filepath.erase(0, 2);
  }
  return filepath;
}